

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::Promise<unsigned_long>::attach<kj::OwnFd,kj::OwnFd>
          (Promise<unsigned_long> *this,OwnFd *attachments,OwnFd *attachments_1)

{
  PromiseNode *pPVar1;
  int *in_RCX;
  Tuple<kj::OwnFd,_kj::OwnFd> local_28;
  PromiseNode *local_20;
  
  local_28.impl.super_TupleElement<0U,_kj::OwnFd>.value.fd = (OwnFd)attachments_1->fd;
  attachments_1->fd = -1;
  local_28.impl.super_TupleElement<1U,_kj::OwnFd>.value.fd = (OwnFd)*in_RCX;
  *in_RCX = -1;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::OwnFd,kj::OwnFd>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::OwnFd,kj::OwnFd>>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_28);
  pPVar1 = local_20;
  local_20 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar1;
  OwnFd::~OwnFd(&local_28.impl.super_TupleElement<1U,_kj::OwnFd>.value);
  OwnFd::~OwnFd((OwnFd *)&local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}